

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O2

void sha1_hash(uchar *data,unsigned_long len,sha1_ctx *ctx)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  void *__dest;
  ulong uVar5;
  ulong uStack_40;
  
  uVar3 = (int)len + ctx->count[0];
  uVar1 = ctx->count[0] & 0x3f;
  ctx->count[0] = uVar3;
  if (uVar3 < len) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  uStack_40 = 0x40 - (ulong)uVar1;
  uVar4 = (ulong)uVar1;
  while( true ) {
    __dest = (void *)((long)ctx->wbuf + uVar4);
    uVar5 = len - uStack_40;
    if (len < uStack_40) break;
    memcpy(__dest,data,uStack_40);
    data = data + uStack_40;
    for (lVar2 = 0x16; lVar2 != 6; lVar2 = lVar2 + -1) {
      uVar1 = ctx->count[lVar2];
      ctx->count[lVar2] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    sha1_compile(ctx);
    uVar4 = 0;
    uStack_40 = 0x40;
    len = uVar5;
  }
  memcpy(__dest,data,len);
  return;
}

Assistant:

VOID_RETURN sha1_hash(const unsigned char data[], unsigned long len, sha1_ctx ctx[1])
{   uint_32t pos = (uint_32t)(ctx->count[0] & SHA1_MASK),
            space = SHA1_BLOCK_SIZE - pos;
    const unsigned char *sp = data;

    if((ctx->count[0] += len) < len)
        ++(ctx->count[1]);

    while(len >= space)     /* tranfer whole blocks if possible  */
    {
        memcpy(((unsigned char*)ctx->wbuf) + pos, sp, space);
        sp += space; len -= space; space = SHA1_BLOCK_SIZE; pos = 0;
        bsw_32(ctx->wbuf, SHA1_BLOCK_SIZE >> 2);
        sha1_compile(ctx);
    }

    memcpy(((unsigned char*)ctx->wbuf) + pos, sp, len);
}